

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeBin::ParseNodeBin
          (ParseNodeBin *this,OpCode nop,charcount_t ichMin,charcount_t ichLim,ParseNode *pnode1,
          ParseNode *pnode2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNode *pnode2_local;
  ParseNode *pnode1_local;
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  OpCode nop_local;
  ParseNodeBin *this_local;
  
  ParseNode::ParseNode(&this->super_ParseNode,nop,ichMin,ichLim);
  if (((((nop == knopMember) || (nop == knopMemberShort)) || (nop == knopObjectPatternMember)) ||
      ((nop == knopGetMember || (nop == knopSetMember)))) &&
     ((pnode1->nop != knopStr && (pnode1->nop != knopComputedName)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/ptree.cpp"
                       ,0x135,
                       "((nop != knopMember && nop != knopMemberShort && nop != knopObjectPatternMember && nop != knopGetMember && nop != knopSetMember) || (pnode1->nop == knopStr || pnode1->nop == knopComputedName))"
                       ,
                       "(nop != knopMember && nop != knopMemberShort && nop != knopObjectPatternMember && nop != knopGetMember && nop != knopSetMember) || (pnode1->nop == knopStr || pnode1->nop == knopComputedName)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((nop == knopDot) && (pnode2->nop != knopName)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/ptree.cpp"
                       ,0x138,"(nop != knopDot || pnode2->nop == knopName)",
                       "nop != knopDot || pnode2->nop == knopName");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->pnode1 = pnode1;
  this->pnode2 = pnode2;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ByteCodeConcatExprOptPhase);
  if (((!bVar2) && (nop == knopAdd)) &&
     ((bVar2 = ParseNode::CanFlattenConcatExpr(pnode1), bVar2 || (pnode2->nop == knopStr)))) {
    (this->super_ParseNode).grfpn = (this->super_ParseNode).grfpn | 0x1000;
  }
  return;
}

Assistant:

ParseNodeBin::ParseNodeBin(OpCode nop, charcount_t ichMin, charcount_t ichLim, ParseNode * pnode1, ParseNode * pnode2)
    : ParseNode(nop, ichMin, ichLim)
{
    // Member name is either a string or a computed name
    Assert((nop != knopMember && nop != knopMemberShort && nop != knopObjectPatternMember && nop != knopGetMember && nop != knopSetMember) 
        || (pnode1->nop == knopStr || pnode1->nop == knopComputedName));

    // Dot's rhs has to be a name;
    Assert(nop != knopDot || pnode2->nop == knopName);

    this->pnode1 = pnode1;
    this->pnode2 = pnode2;

    // Statically detect if the add is a concat
    if (!PHASE_OFF1(Js::ByteCodeConcatExprOptPhase))
    {
        // We can't flatten the concat expression if the LHS is not a flatten concat already
        // e.g.  a + (<str> + b)
        //      Side effect of ToStr(b) need to happen first before ToStr(a)
        //      If we flatten the concat expression, we will do ToStr(a) before ToStr(b)
        if ((nop == knopAdd) && (pnode1->CanFlattenConcatExpr() || pnode2->nop == knopStr))
        {
            this->grfpn |= fpnCanFlattenConcatExpr;
        }
    }
}